

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

void __thiscall HEkkPrimal::solvePhase2(HEkkPrimal *this)

{
  uint uVar1;
  HEkk *this_00;
  HighsOptions *pHVar2;
  HEkk *pHVar3;
  bool bVar4;
  HighsDebugStatus HVar5;
  EVP_PKEY_CTX *pEVar6;
  HighsLogOptions *log_options_;
  string local_50;
  
  this_00 = this->ekk_instance_;
  pHVar2 = this_00->options_;
  (this_00->status_).has_dual_objective_value = false;
  (this_00->status_).has_primal_objective_value = false;
  bVar4 = HEkk::bailout(this_00);
  if (!bVar4) {
    log_options_ = &(pHVar2->super_HighsOptionsStruct).log_options;
    highsLogDev(log_options_,kDetailed,"primal-phase2-start\n");
    this->max_max_local_primal_infeasibility_ = 0.0;
    this->max_max_ignored_violation_ = 0.0;
    if ((this->ekk_instance_->info_).valid_backtracking_basis_ == false) {
      HEkk::putBacktrackingBasis(this->ekk_instance_);
    }
    do {
      rebuild(this);
      if ((this->solve_phase | 2U) == 0xffffffff) {
        return;
      }
      bVar4 = HEkk::bailout(this->ekk_instance_);
      if (bVar4) {
        return;
      }
      if (this->solve_phase == 1) goto LAB_00358a78;
      do {
        iterate(this);
        bVar4 = HEkk::bailout(this->ekk_instance_);
        if (bVar4) {
          return;
        }
        if (this->solve_phase == -3) {
          return;
        }
      } while (this->rebuild_reason == 0);
    } while ((((this_00->status_).has_fresh_rebuild != true) || (this->num_flip_since_rebuild != 0))
            || (bVar4 = HEkk::rebuildRefactor(this->ekk_instance_,this->rebuild_reason), bVar4));
    bVar4 = HEkk::tabooBadBasisChange(this->ekk_instance_);
    if (bVar4) {
      this->solve_phase = 5;
    }
    else {
LAB_00358a78:
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"End of solvePhase2","");
      HVar5 = debugPrimalSimplex(this,&local_50,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (HVar5 == kLogicalError) {
        this->solve_phase = -3;
      }
      else if (this->solve_phase == 1) {
        highsLogDev(log_options_,kDetailed,"primal-return-phase1\n");
      }
      else if (this->variable_in == -1) {
        pEVar6 = (EVP_PKEY_CTX *)0x2;
        highsLogDev(log_options_,kDetailed,"primal-phase-2-optimal\n");
        cleanup(this,pEVar6);
        if ((this->ekk_instance_->info_).num_primal_infeasibilities < 1) {
          this->solve_phase = 0;
          highsLogDev(log_options_,kDetailed,"problem-optimal\n");
          this_00->model_status_ = kOptimal;
          HEkk::computeDualObjectiveValue(this->ekk_instance_,2);
        }
        else {
          this->solve_phase = 4;
        }
      }
      else {
        uVar1 = this->row_out;
        if (uVar1 == 0xfffffffe) {
          printf("HEkkPrimal::solvePhase2 row_out = %d solve %d\n",0xfffffffe,
                 (ulong)(uint)this->ekk_instance_->debug_solve_call_num_);
          fflush(_stdout);
        }
        else {
          if (-1 < (int)uVar1) {
            printf("HEkkPrimal::solvePhase2 row_out = %d solve %d\n",(ulong)uVar1,
                   (ulong)(uint)this->ekk_instance_->debug_solve_call_num_);
            fflush(_stdout);
          }
          pEVar6 = (EVP_PKEY_CTX *)&DAT_00000001;
          highsLogDev(log_options_,kInfo,"primal-phase-2-unbounded\n");
          if ((this->ekk_instance_->info_).bounds_perturbed == true) {
            cleanup(this,pEVar6);
            if (0 < (this->ekk_instance_->info_).num_primal_infeasibilities) {
              this->solve_phase = 1;
            }
          }
          else {
            this->solve_phase = -2;
            HighsRayRecord::clear(&this->ekk_instance_->primal_ray_record_);
            pHVar3 = this->ekk_instance_;
            (pHVar3->primal_ray_record_).index = this->variable_in;
            (pHVar3->primal_ray_record_).sign = -this->move_in;
            highsLogDev(log_options_,kInfo,"problem-primal-unbounded\n");
            this_00->model_status_ = kUnbounded;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void HEkkPrimal::solvePhase2() {
  HighsOptions& options = *ekk_instance_.options_;
  HighsSimplexStatus& status = ekk_instance_.status_;
  HighsModelStatus& model_status = ekk_instance_.model_status_;
  // When starting a new phase the (updated) primal objective function
  // value isn't known. Indicate this so that when the value
  // computed from scratch in build() isn't checked against the
  // updated value
  status.has_primal_objective_value = false;
  status.has_dual_objective_value = false;
  // Possibly bail out immediately if iteration limit is current value
  if (ekk_instance_.bailout()) return;
  highsLogDev(options.log_options, HighsLogType::kDetailed,
              "primal-phase2-start\n");
  phase2UpdatePrimal(true);

  // If there's no backtracking basis Save the initial basis in case of
  // backtracking
  if (!ekk_instance_.info_.valid_backtracking_basis_)
    ekk_instance_.putBacktrackingBasis();

  // Main solving structure
  for (;;) {
    //
    // Rebuild
    //
    // solve_phase = kSolvePhaseError is set if the basis matrix is singular
    rebuild();
    if (solve_phase == kSolvePhaseError) return;
    if (solve_phase == kSolvePhaseUnknown) return;
    if (ekk_instance_.bailout()) return;
    assert(solve_phase == kSolvePhase1 || solve_phase == kSolvePhase2);
    //
    // solve_phase = kSolvePhase1 is set if primal infeasibilities
    // are found in rebuild(), in which case return for phase 1
    if (solve_phase == kSolvePhase1) break;

    for (;;) {
      iterate();
      if (ekk_instance_.bailout()) return;
      if (solve_phase == kSolvePhaseError) return;
      assert(solve_phase == kSolvePhase2);
      if (rebuild_reason) break;
    }
    // If the data are fresh from rebuild() and no flips have
    // occurred, possibly break out of the outer loop to see what's
    // occurred
    bool finished = status.has_fresh_rebuild && num_flip_since_rebuild == 0 &&
                    !ekk_instance_.rebuildRefactor(rebuild_reason);
    if (finished && ekk_instance_.tabooBadBasisChange()) {
      // A bad basis change has had to be made taboo without any other
      // basis changes or flips having been performed from a fresh
      // rebuild. In other words, the only basis change that could be
      // made is not permitted, so no definitive statement about the
      // LP can be made.
      solve_phase = kSolvePhaseTabooBasis;
      return;
    }
    if (finished) break;
  }
  // If bailing out, should have returned already
  assert(!ekk_instance_.solve_bailout_);
  if (debugPrimalSimplex("End of solvePhase2") ==
      HighsDebugStatus::kLogicalError) {
    solve_phase = kSolvePhaseError;
    return;
  }
  if (solve_phase == kSolvePhase1) {
    highsLogDev(options.log_options, HighsLogType::kDetailed,
                "primal-return-phase1\n");
  } else if (variable_in == -1) {
    // There is no candidate in CHUZC, even after rebuild so probably optimal
    highsLogDev(options.log_options, HighsLogType::kDetailed,
                "primal-phase-2-optimal\n");
    // Remove any bound perturbations and see if basis is still primal feasible
    cleanup();
    if (ekk_instance_.info_.num_primal_infeasibilities > 0) {
      // There are primal infeasibilities, so consider performing dual
      // simplex iterations to get primal feasibility
      solve_phase = kSolvePhaseOptimalCleanup;
    } else {
      // There are no primal infeasibilities so optimal!
      solve_phase = kSolvePhaseOptimal;
      highsLogDev(options.log_options, HighsLogType::kDetailed,
                  "problem-optimal\n");
      model_status = HighsModelStatus::kOptimal;
      ekk_instance_.computeDualObjectiveValue();  // Why?
    }
  } else if (row_out == kNoRowSought) {
    // CHUZR has not been performed - because the chosen reduced cost
    // was unattractive when computed from scratch and no rebuild was
    // required. This is very rare and should be handled otherwise
    //
    printf("HEkkPrimal::solvePhase2 row_out = %d solve %d\n", (int)row_out,
           (int)ekk_instance_.debug_solve_call_num_);
    fflush(stdout);
    assert(row_out != kNoRowSought);
  } else {
    // No candidate in CHUZR
    if (row_out >= 0) {
      printf("HEkkPrimal::solvePhase2 row_out = %d solve %d\n", (int)row_out,
             (int)ekk_instance_.debug_solve_call_num_);
      fflush(stdout);
    }
    // Ensure that CHUZR was performed and found no row
    assert(row_out == kNoRowChosen);

    // There is no candidate in CHUZR, so probably primal unbounded
    highsLogDev(options.log_options, HighsLogType::kInfo,
                "primal-phase-2-unbounded\n");
    if (ekk_instance_.info_.bounds_perturbed) {
      // If the bounds have been perturbed, clean up and return
      cleanup();
      // If there are primal infeasibilities, go back to phase 1
      if (ekk_instance_.info_.num_primal_infeasibilities > 0)
        solve_phase = kSolvePhase1;
    } else {
      // The bounds have not been perturbed, so primal unbounded
      solve_phase = kSolvePhaseExit;
      // Primal unbounded, so save primal ray
      savePrimalRay();
      // Model status should be unset
      assert(model_status == HighsModelStatus::kNotset);
      highsLogDev(options.log_options, HighsLogType::kInfo,
                  "problem-primal-unbounded\n");
      model_status = HighsModelStatus::kUnbounded;
    }
  }
}